

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem1.cpp
# Opt level: O2

bool binSearch(int *arr,int size,int key)

{
  bool bVar1;
  int local_1c;
  
  local_1c = key;
  std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(arr,arr + size);
  bVar1 = std::binary_search<int*,int>(arr,arr + size,&local_1c);
  return bVar1;
}

Assistant:

bool binSearch(int arr[],int size,int key){ sort(arr, arr+size); return binary_search(arr, arr+size, key); }